

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O1

uint * __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::operator()
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,uint d0,...)

{
  mapped_type mVar1;
  _Hash_node_base *p_Var2;
  char in_AL;
  uint uVar3;
  mapped_type *pmVar4;
  undefined8 *puVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  uint *puVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  uint local_ec;
  undefined8 local_e8;
  uint *local_e0;
  uint *local_d8;
  uint local_c8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  puVar8 = (uint *)&stack0x00000008;
  local_e8 = 0x3000000010;
  local_e0 = puVar8;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (this->_dims[0] <= d0) {
LAB_0014672c:
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "Index out of bounds!";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  local_e8._0_4_ = 0x10;
  lVar6 = 0;
  uVar3 = (uint)local_e8;
  do {
    if (uVar3 < 0x29) {
      uVar9 = (ulong)uVar3;
      uVar3 = uVar3 + 8;
      local_e8 = CONCAT44(local_e8._4_4_,uVar3);
      puVar10 = (uint *)((long)local_d8 + uVar9);
    }
    else {
      local_e0 = puVar8 + 2;
      puVar10 = puVar8;
      puVar8 = local_e0;
    }
    if (this->_dims[lVar6 + 1] <= *puVar10) goto LAB_0014672c;
    d0 = d0 * this->_dims[lVar6 + 1] + *puVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  uVar9 = (this->siteMap)._M_h._M_bucket_count;
  uVar7 = (ulong)(long)(int)d0 % uVar9;
  p_Var11 = (this->siteMap)._M_h._M_buckets[uVar7];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var11->_M_nxt, p_Var12 = p_Var11, d0 != *(uint *)&p_Var11->_M_nxt[1]._M_nxt)) {
    while (p_Var11 = p_Var2, p_Var2 = p_Var11->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)(long)(int)*(uint *)&p_Var2[1]._M_nxt % uVar9 != uVar7) ||
         (p_Var12 = p_Var11, d0 == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_001466ee;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_001466ee:
  if ((p_Var12 == (__node_base_ptr)0x0) || (p_Var12->_M_nxt == (_Hash_node_base *)0x0)) {
    mVar1 = this->defaultValue;
    local_ec = d0;
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->siteMap,(key_type *)&local_ec);
    *pmVar4 = mVar1;
  }
  local_ec = d0;
  pmVar4 = std::__detail::
           _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->siteMap,(key_type *)&local_ec);
  return pmVar4;
}

Assistant:

inline T& operator()(unsigned int d0, ...) {
            unsigned int index = 0;
            va_list vl;
            va_start(vl, d0);
            index = linear_index(d0, vl);
            va_end(vl);

            auto iter = siteMap.find(index);
            if(iter == siteMap.end())
                siteMap[index] = defaultValue;

            return siteMap[index];
        }